

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_ErrorObject * GPU_PopErrorCode(void)

{
  undefined8 uVar1;
  GPU_ErrorObject *pGVar2;
  uint uVar3;
  ulong uVar4;
  GPU_ErrorObject *in_RDI;
  long lVar5;
  
  in_RDI->function = (char *)0x0;
  *(undefined8 *)&in_RDI->error = 0;
  in_RDI->details = (char *)0x0;
  gpu_init_error_queue();
  uVar3 = _gpu_num_error_codes;
  pGVar2 = _gpu_error_code_queue;
  if (_gpu_num_error_codes != 0) {
    strcpy(_gpu_error_code_result.function,_gpu_error_code_queue->function);
    _gpu_error_code_result.error = pGVar2->error;
    strcpy(_gpu_error_code_result.details,pGVar2->details);
    uVar1 = CONCAT44(_gpu_error_code_result._12_4_,_gpu_error_code_result.error);
    in_RDI->function = _gpu_error_code_result.function;
    *(undefined8 *)&in_RDI->error = uVar1;
    in_RDI->details = _gpu_error_code_result.details;
    _gpu_num_error_codes = uVar3 - 1;
    if (_gpu_num_error_codes != 0) {
      uVar4 = (ulong)_gpu_num_error_codes;
      lVar5 = 0;
      do {
        strcpy(*(char **)((long)&pGVar2->function + lVar5),
               *(char **)((long)&pGVar2[1].function + lVar5));
        *(undefined4 *)((long)&pGVar2->error + lVar5) =
             *(undefined4 *)((long)&pGVar2[1].error + lVar5);
        strcpy(*(char **)((long)&pGVar2->details + lVar5),
               *(char **)((long)&pGVar2[1].details + lVar5));
        lVar5 = lVar5 + 0x18;
      } while (uVar4 * 0x18 != lVar5);
    }
  }
  return in_RDI;
}

Assistant:

GPU_ErrorObject GPU_PopErrorCode(void)
{
    unsigned int i;
    GPU_ErrorObject result = {NULL, GPU_ERROR_NONE, NULL};

    gpu_init_error_queue();

    if(_gpu_num_error_codes <= 0)
        return result;

    // Pop the oldest
    strcpy(_gpu_error_code_result.function, _gpu_error_code_queue[0].function);
    _gpu_error_code_result.error = _gpu_error_code_queue[0].error;
    strcpy(_gpu_error_code_result.details, _gpu_error_code_queue[0].details);

    // We'll be returning that one
    result = _gpu_error_code_result;

    // Move the rest down
    _gpu_num_error_codes--;
    for(i = 0; i < _gpu_num_error_codes; i++)
    {
        strcpy(_gpu_error_code_queue[i].function, _gpu_error_code_queue[i+1].function);
        _gpu_error_code_queue[i].error = _gpu_error_code_queue[i+1].error;
        strcpy(_gpu_error_code_queue[i].details, _gpu_error_code_queue[i+1].details);
    }
    return result;
}